

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  int iVar1;
  parse_buffer *input_buffer_local;
  cJSON *item_local;
  
  if ((input_buffer == (parse_buffer *)0x0) || (input_buffer->content == (uchar *)0x0)) {
    item_local._4_4_ = 0;
  }
  else {
    if (((input_buffer != (parse_buffer *)0x0) && (input_buffer->offset + 4 <= input_buffer->length)
        ) && (iVar1 = strncmp((char *)(input_buffer->content + input_buffer->offset),"null",4),
             iVar1 == 0)) {
      item->type = 4;
      input_buffer->offset = input_buffer->offset + 4;
      return 1;
    }
    if (((input_buffer != (parse_buffer *)0x0) && (input_buffer->offset + 5 <= input_buffer->length)
        ) && (iVar1 = strncmp((char *)(input_buffer->content + input_buffer->offset),"false",5),
             iVar1 == 0)) {
      item->type = 1;
      input_buffer->offset = input_buffer->offset + 5;
      return 1;
    }
    if (((input_buffer != (parse_buffer *)0x0) && (input_buffer->offset + 4 <= input_buffer->length)
        ) && (iVar1 = strncmp((char *)(input_buffer->content + input_buffer->offset),"true",4),
             iVar1 == 0)) {
      item->type = 2;
      item->valueint = 1;
      input_buffer->offset = input_buffer->offset + 4;
      return 1;
    }
    if (((input_buffer == (parse_buffer *)0x0) || (input_buffer->length <= input_buffer->offset)) ||
       (input_buffer->content[input_buffer->offset] != '\"')) {
      if (((input_buffer == (parse_buffer *)0x0) || (input_buffer->length <= input_buffer->offset))
         || ((input_buffer->content[input_buffer->offset] != '-' &&
             ((input_buffer->content[input_buffer->offset] < 0x30 ||
              (0x39 < input_buffer->content[input_buffer->offset])))))) {
        if ((input_buffer == (parse_buffer *)0x0) ||
           ((input_buffer->length <= input_buffer->offset ||
            (input_buffer->content[input_buffer->offset] != '[')))) {
          if ((input_buffer == (parse_buffer *)0x0) ||
             ((input_buffer->length <= input_buffer->offset ||
              (input_buffer->content[input_buffer->offset] != '{')))) {
            item_local._4_4_ = 0;
          }
          else {
            item_local._4_4_ = parse_object(item,input_buffer);
          }
        }
        else {
          item_local._4_4_ = parse_array(item,input_buffer);
        }
      }
      else {
        item_local._4_4_ = parse_number(item,input_buffer);
      }
    }
    else {
      item_local._4_4_ = parse_string(item,input_buffer);
    }
  }
  return item_local._4_4_;
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }

    return false;
}